

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O3

string * __thiscall
helics::PotentialInterfacesManager::generateQueryResponse_abi_cxx11_
          (string *__return_storage_ptr__,PotentialInterfacesManager *this,string_view query)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  undefined4 uVar3;
  json_value jVar4;
  string *psVar5;
  reference pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Rb_tree_node_base *p_Var8;
  char *pcVar9;
  _Alloc_hider _Var10;
  _Base_ptr p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  json interfaces;
  string templateKey;
  data local_130;
  _Rb_tree_node_base *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  data local_f8;
  data local_e8;
  key_type local_d8;
  key_type local_b8;
  string *local_98;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  pcVar9 = query._M_str;
  if (query._M_len == 0x14) {
    uVar3 = *(undefined4 *)(pcVar9 + 0x10);
    auVar13[0] = -((char)uVar3 == 'a');
    auVar13[1] = -((char)((uint)uVar3 >> 8) == 'c');
    auVar13[2] = -((char)((uint)uVar3 >> 0x10) == 'e');
    auVar13[3] = -((char)((uint)uVar3 >> 0x18) == 's');
    auVar13[4] = 0xff;
    auVar13[5] = 0xff;
    auVar13[6] = 0xff;
    auVar13[7] = 0xff;
    auVar13[8] = 0xff;
    auVar13[9] = 0xff;
    auVar13[10] = 0xff;
    auVar13[0xb] = 0xff;
    auVar13[0xc] = 0xff;
    auVar13[0xd] = 0xff;
    auVar13[0xe] = 0xff;
    auVar13[0xf] = 0xff;
    auVar12[0] = -(*pcVar9 == 'p');
    auVar12[1] = -(pcVar9[1] == 'o');
    auVar12[2] = -(pcVar9[2] == 't');
    auVar12[3] = -(pcVar9[3] == 'e');
    auVar12[4] = -(pcVar9[4] == 'n');
    auVar12[5] = -(pcVar9[5] == 't');
    auVar12[6] = -(pcVar9[6] == 'i');
    auVar12[7] = -(pcVar9[7] == 'a');
    auVar12[8] = -(pcVar9[8] == 'l');
    auVar12[9] = -(pcVar9[9] == '_');
    auVar12[10] = -(pcVar9[10] == 'i');
    auVar12[0xb] = -(pcVar9[0xb] == 'n');
    auVar12[0xc] = -(pcVar9[0xc] == 't');
    auVar12[0xd] = -(pcVar9[0xd] == 'e');
    auVar12[0xe] = -(pcVar9[0xe] == 'r');
    auVar12[0xf] = -(pcVar9[0xf] == 'f');
    auVar12 = auVar12 & auVar13;
    if (((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) &&
       (((this->respondedToCommand)._M_base._M_i & 1U) == 0)) {
      local_130.m_type = null;
      local_130.m_value.object = (object_t *)0x0;
      p_Var8 = (_Rb_tree_node_base *)
               (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_120 = (_Rb_tree_node_base *)&(this->potInterfaces)._M_t._M_impl.super__Rb_tree_header;
      local_98 = __return_storage_ptr__;
      if (p_Var8 != local_120) {
        paVar1 = &local_50.field_2;
        do {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_e8,(initializer_list_t)ZEXT816(0),false,array);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_130,&local_90);
          vVar2 = (pvVar6->m_data).m_type;
          (pvVar6->m_data).m_type = local_e8.m_type;
          jVar4 = (pvVar6->m_data).m_value;
          (pvVar6->m_data).m_value = local_e8.m_value;
          local_e8.m_type = vVar2;
          local_e8.m_value = jVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_e8);
          for (p_Var11 = p_Var8[2]._M_left; p_Var11 != (_Base_ptr)0x0;
              p_Var11 = *(_Base_ptr *)p_Var11) {
            if (this->hasPotentialTargetting == true) {
              local_50._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,*(long *)(p_Var8 + 1),
                         (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)&local_130,&local_50);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&p_Var11[1]._M_parent);
              paVar7 = paVar1;
              _Var10._M_p = local_50._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != paVar1) {
LAB_0021df7e:
                operator_delete(_Var10._M_p,paVar7->_M_allocated_capacity + 1);
              }
            }
            else {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)(p_Var8 + 1),
                         (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)&local_130,&local_b8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_Var11->_M_parent);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_118);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_118);
              paVar7 = &local_b8.field_2;
              _Var10._M_p = local_b8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar7) goto LAB_0021df7e;
            }
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != local_120);
      }
      p_Var8 = (_Rb_tree_node_base *)
               (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_120 = (_Rb_tree_node_base *)
                  &(this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header;
      if (p_Var8 != local_120) {
        do {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back(&local_118);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(&local_118,"_templates");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_f8,(initializer_list_t)ZEXT816(0),false,array);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_118._M_dataplus._M_p,
                     local_118._M_dataplus._M_p + local_118._M_string_length);
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)&local_130,&local_d8);
          vVar2 = (pvVar6->m_data).m_type;
          (pvVar6->m_data).m_type = local_f8.m_type;
          jVar4 = (pvVar6->m_data).m_value;
          (pvVar6->m_data).m_value = local_f8.m_value;
          local_f8.m_type = vVar2;
          local_f8.m_value = jVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_f8);
          for (p_Var11 = p_Var8[2]._M_left; p_Var11 != (_Base_ptr)0x0;
              p_Var11 = *(_Base_ptr *)p_Var11) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_118._M_dataplus._M_p,
                       local_118._M_dataplus._M_p + local_118._M_string_length);
            pvVar6 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&local_130,&local_70);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&p_Var11[1]._M_parent);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != local_120);
      }
      psVar5 = local_98;
      fileops::generateJsonString(local_98,(json *)&local_130,true);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_130);
      return psVar5;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string PotentialInterfacesManager::generateQueryResponse(std::string_view query)
{
    if (query == "potential_interfaces") {
        if (respondedToCommand.load()) {
            // we have already generated interfaces so no need to respond to the query
            return std::string{};
        }
        nlohmann::json interfaces;
        for (const auto& iType : potInterfaces) {
            interfaces[iType.first] = nlohmann::json::array();
            for (const auto& ispec : iType.second) {
                if (hasPotentialTargetting) {
                    interfaces[iType.first].push_back(ispec.second);
                } else {
                    interfaces[iType.first].push_back(ispec.first);
                }
            }
        }
        for (const auto& iType : potInterfaceTemplates) {
            std::string templateKey = iType.first;
            templateKey.pop_back();
            templateKey += "_templates";
            interfaces[templateKey] = nlohmann::json::array();
            for (const auto& ispec : iType.second) {
                interfaces[templateKey].push_back(ispec.second);
            }
        }
        return fileops::generateJsonString(interfaces);
    }
    return std::string{};
}